

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Put
          (RequestsCache *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_90;
  RequestHolder local_70;
  ResponseHandler *local_20;
  ResponseHandler *aHandler_local;
  RequestPtr *aRequest_local;
  RequestsCache *this_local;
  
  local_20 = aHandler;
  aHandler_local = (ResponseHandler *)aRequest;
  aRequest_local = (RequestPtr *)this;
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            (&local_90,aHandler);
  RequestHolder::RequestHolder(&local_70,aRequest,&local_90);
  Put(this,&local_70);
  RequestHolder::~RequestHolder(&local_70);
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::~function
            (&local_90);
  return;
}

Assistant:

void Coap::RequestsCache::Put(const RequestPtr &aRequest, ResponseHandler aHandler)
{
    Put({aRequest, aHandler});
}